

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::draw_vline
          (Fl_Text_Display *this,int visLineNum,int leftClip,int rightClip,int leftCharIndex,
          int rightCharIndex)

{
  int iVar1;
  int iVar2;
  int lineStartPos;
  int lineLen;
  int rightClip_00;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  
  if ((-1 < visLineNum) && (visLineNum < this->mNVisibleLines)) {
    iVar1 = this->mMaxsize;
    iVar2 = (this->text_area).y;
    lineStartPos = this->mLineStarts[(uint)visLineNum];
    if (lineStartPos == -1) {
      lineLen = 0;
    }
    else {
      lineLen = vline_length(this,visLineNum);
    }
    rightClip_00 = (this->text_area).w + (this->text_area).x;
    if (rightClip < rightClip_00) {
      rightClip_00 = rightClip;
    }
    handle_vline(this,0,lineStartPos,lineLen,leftCharIndex,rightCharIndex,iVar1 * visLineNum + iVar2
                 ,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,rightClip_00);
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_vline(int visLineNum, int leftClip, int rightClip,
                                 int leftCharIndex, int rightCharIndex) {
  int Y, lineStartPos, lineLen, fontHeight;

  //  printf("draw_vline(visLineNum=%d, leftClip=%d, rightClip=%d, leftCharIndex=%d, rightCharIndex=%d)\n",
  //         visLineNum, leftClip, rightClip, leftCharIndex, rightCharIndex);
  //  printf("nNVisibleLines=%d\n", mNVisibleLines);

  /* If line is not displayed, skip it */
  if ( visLineNum < 0 || visLineNum >= mNVisibleLines )
    return;

  /* Calculate Y coordinate of the string to draw */
  fontHeight = mMaxsize;
  Y = text_area.y + visLineNum * fontHeight;

  /* Get the text, length, and  buffer position of the line to display */
  lineStartPos = mLineStarts[ visLineNum ];
  if ( lineStartPos == -1 ) {
    lineLen = 0;
  } else {
    lineLen = vline_length( visLineNum );
  }

  /* Shrink the clipping range to the active display area */
  leftClip = max( text_area.x, leftClip );
  rightClip = min( rightClip, text_area.x + text_area.w );

  handle_vline(DRAW_LINE,
               lineStartPos, lineLen, leftCharIndex, rightCharIndex,
               Y, Y+fontHeight, leftClip, rightClip);
  return;
}